

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O3

AddrOpnd * IR::AddrOpnd::NewFromNumberVar(double value,Func *func,bool dontEncode)

{
  undefined1 *puVar1;
  bool bVar2;
  anon_union_2_4_ea848c7b_for_ValueType_13 aVar3;
  Var address;
  AddrOpnd *pAVar4;
  Var in_R8;
  
  address = Func::AllocateNumber(func,value);
  pAVar4 = New((intptr_t)address,AddrOpndKindDynamicVar,func,dontEncode,in_R8);
  bVar2 = Js::JavascriptNumber::IsInt32(value);
  if (bVar2) {
    aVar3.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetInt(false);
  }
  else {
    aVar3.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         (anon_union_2_4_ea848c7b_for_ValueType_13)0x108;
  }
  (pAVar4->super_Opnd).m_valueType.field_0.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)aVar3;
  puVar1 = &(pAVar4->super_Opnd).field_0xb;
  *puVar1 = *puVar1 | 1;
  return pAVar4;
}

Assistant:

AddrOpnd *
AddrOpnd::NewFromNumberVar(double value, Func *func, bool dontEncode /* = false */)
{
    Js::Var var = func->AllocateNumber((double)value);
    AddrOpnd* addrOpnd = New((intptr_t)var, AddrOpndKindDynamicVar, func, dontEncode);
    addrOpnd->m_valueType =
        Js::JavascriptNumber::IsInt32(value)
        ? ValueType::GetInt(false)
        : ValueType::Float;
    addrOpnd->SetValueTypeFixed();

    return addrOpnd;
}